

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp_tree_handler.c
# Opt level: O0

ion_err_t bpptree_destroy_dictionary(ion_dictionary_id_t id)

{
  int iVar1;
  int iVar2;
  int actual_value_filename_length;
  int actual_addr_filename_length;
  char value_filename [12];
  char addr_filename [12];
  ion_dictionary_id_t id_local;
  
  iVar1 = dictionary_get_filename(id,"bpt",value_filename + 4);
  iVar2 = dictionary_get_filename(id,"val",(char *)&actual_value_filename_length);
  if ((iVar1 < 0xc) && (iVar2 < 0xc)) {
    ion_fremove(value_filename + 4);
    ion_fremove((char *)&actual_value_filename_length);
    addr_filename[0xb] = '\0';
  }
  else {
    addr_filename[0xb] = '\x04';
  }
  return addr_filename[0xb];
}

Assistant:

ion_err_t
bpptree_destroy_dictionary(
	ion_dictionary_id_t id
) {
	char	addr_filename[ION_MAX_FILENAME_LENGTH];
	char	value_filename[ION_MAX_FILENAME_LENGTH];

	int actual_addr_filename_length		= dictionary_get_filename(id, "bpt", addr_filename);
	int actual_value_filename_length	= dictionary_get_filename(id, "val", value_filename);

	if ((actual_addr_filename_length >= ION_MAX_FILENAME_LENGTH) || (actual_value_filename_length >= ION_MAX_FILENAME_LENGTH)) {
		return err_dictionary_destruction_error;
	}

	ion_fremove(addr_filename);
	ion_fremove(value_filename);

	return err_ok;
}